

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.h
# Opt level: O3

bool __thiscall GouraudShader::fragment(GouraudShader *this,Model *model,vec3f bar,TGAColor *color)

{
  char cVar1;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined6 uVar8;
  undefined8 uVar9;
  unkbyte10 Var10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [14];
  short sVar13;
  undefined4 uVar14;
  int iVar15;
  double dVar16;
  int iVar17;
  char cVar18;
  undefined1 uVar19;
  char cVar20;
  undefined1 uVar21;
  char cVar22;
  char cVar23;
  double dVar24;
  char cVar2;
  
  dVar16 = dot<3ul,double>(&this->varying_ity,&bar);
  dVar24 = 1.0;
  if (dVar16 <= 1.0) {
    dVar24 = dVar16;
  }
  if (dVar24 <= 0.0) {
    dVar24 = 0.0;
  }
  iVar15 = (int)(dVar24 * 255.0);
  iVar17 = (int)(dVar24 * 255.0);
  cVar18 = (char)iVar17;
  uVar19 = (undefined1)((uint)iVar17 >> 8);
  cVar20 = (char)((uint)iVar17 >> 0x10);
  uVar21 = (undefined1)((uint)iVar17 >> 0x18);
  cVar22 = (char)iVar15;
  cVar23 = (char)((uint)iVar15 >> 0x10);
  uVar8 = CONCAT15(uVar19,CONCAT14(cVar18,iVar15));
  uVar9 = CONCAT17(uVar21,CONCAT16(cVar20,uVar8));
  Var10 = CONCAT19((char)((uint)iVar15 >> 8),CONCAT18(cVar22,uVar9));
  auVar11[10] = cVar23;
  auVar11._0_10_ = Var10;
  auVar11[0xb] = (char)((uint)iVar15 >> 0x18);
  auVar12[0xc] = cVar18;
  auVar12._0_12_ = auVar11;
  auVar12[0xd] = uVar19;
  auVar7[0xe] = cVar20;
  auVar7._0_14_ = auVar12;
  auVar7[0xf] = uVar21;
  sVar3 = (short)iVar15;
  cVar1 = (0 < sVar3) * (sVar3 < 0x100) * cVar22 - (0xff < sVar3);
  sVar3 = (short)((uint)iVar15 >> 0x10);
  sVar4 = (short)((uint6)uVar8 >> 0x20);
  cVar2 = (0 < sVar4) * (sVar4 < 0x100) * cVar18 - (0xff < sVar4);
  sVar4 = (short)((ulong)uVar9 >> 0x30);
  sVar5 = (short)((unkuint10)Var10 >> 0x40);
  cVar22 = (0 < sVar5) * (sVar5 < 0x100) * cVar22 - (0xff < sVar5);
  sVar5 = auVar11._10_2_;
  sVar6 = auVar12._12_2_;
  cVar18 = (0 < sVar6) * (sVar6 < 0x100) * cVar18 - (0xff < sVar6);
  sVar6 = auVar7._14_2_;
  sVar13 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * cVar23 - (0xff < sVar3),cVar1);
  uVar14 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * cVar20 - (0xff < sVar4),CONCAT12(cVar2,sVar13));
  uVar8 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * cVar23 - (0xff < sVar5),CONCAT14(cVar22,uVar14));
  sVar3 = (short)((uint)uVar14 >> 0x10);
  sVar4 = (short)((uint6)uVar8 >> 0x20);
  sVar5 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * cVar20 - (0xff < sVar6),
                           CONCAT16(cVar18,uVar8)) >> 0x30);
  *(uint *)color->bgra =
       CONCAT13((0 < sVar5) * (sVar5 < 0x100) * cVar18 - (0xff < sVar5),
                CONCAT12((0 < sVar4) * (sVar4 < 0x100) * cVar22 - (0xff < sVar4),
                         CONCAT11((0 < sVar3) * (sVar3 < 0x100) * cVar2 - (0xff < sVar3),
                                  (0 < sVar13) * (sVar13 < 0x100) * cVar1 - (0xff < sVar13))));
  color->bytespp = '\x04';
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        double intensity = dot(varying_ity, bar);
        color = TGAColor(255, 255, 255) * intensity;
        return false;
    }